

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int cm_zlib_deflateSetDictionary(z_streamp strm,Bytef *dictionary,uInt dictLength)

{
  uInt uVar1;
  deflate_state *s_00;
  Bytef *pBVar2;
  int iVar3;
  uLong uVar4;
  uchar *next;
  uint avail;
  int wrap;
  uInt n;
  uInt str;
  deflate_state *s;
  Bytef *pBStack_20;
  uInt dictLength_local;
  Bytef *dictionary_local;
  z_streamp strm_local;
  
  iVar3 = deflateStateCheck(strm);
  if ((iVar3 == 0) && (dictionary != (Bytef *)0x0)) {
    s_00 = strm->state;
    iVar3 = s_00->wrap;
    if ((iVar3 == 2) || (((iVar3 == 1 && (s_00->status != 0x2a)) || (s_00->lookahead != 0)))) {
      strm_local._4_4_ = -2;
    }
    else {
      if (iVar3 == 1) {
        uVar4 = cm_zlib_adler32(strm->adler,dictionary,dictLength);
        strm->adler = uVar4;
      }
      s_00->wrap = 0;
      s._4_4_ = dictLength;
      pBStack_20 = dictionary;
      if (s_00->w_size <= dictLength) {
        if (iVar3 == 0) {
          s_00->head[s_00->hash_size - 1] = 0;
          memset(s_00->head,0,(ulong)(s_00->hash_size - 1) << 1);
          s_00->strstart = 0;
          s_00->block_start = 0;
          s_00->insert = 0;
        }
        pBStack_20 = dictionary + (dictLength - s_00->w_size);
        s._4_4_ = s_00->w_size;
      }
      uVar1 = strm->avail_in;
      pBVar2 = strm->next_in;
      strm->avail_in = s._4_4_;
      strm->next_in = pBStack_20;
      fill_window(s_00);
      while (2 < s_00->lookahead) {
        wrap = s_00->strstart;
        avail = s_00->lookahead - 2;
        do {
          s_00->ins_h = (s_00->ins_h << ((byte)s_00->hash_shift & 0x1f) ^
                        (uint)s_00->window[wrap + 2]) & s_00->hash_mask;
          s_00->prev[wrap & s_00->w_mask] = s_00->head[s_00->ins_h];
          s_00->head[s_00->ins_h] = (Posf)wrap;
          wrap = wrap + 1;
          avail = avail - 1;
        } while (avail != 0);
        s_00->strstart = wrap;
        s_00->lookahead = 2;
        fill_window(s_00);
      }
      s_00->strstart = s_00->lookahead + s_00->strstart;
      s_00->block_start = (ulong)s_00->strstart;
      s_00->insert = s_00->lookahead;
      s_00->lookahead = 0;
      s_00->prev_length = 2;
      s_00->match_length = 2;
      s_00->match_available = 0;
      strm->next_in = pBVar2;
      strm->avail_in = uVar1;
      s_00->wrap = iVar3;
      strm_local._4_4_ = 0;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateSetDictionary (strm, dictionary, dictLength)
    z_streamp strm;
    const Bytef *dictionary;
    uInt  dictLength;
{
    deflate_state *s;
    uInt str, n;
    int wrap;
    unsigned avail;
    z_const unsigned char *next;

    if (deflateStateCheck(strm) || dictionary == Z_NULL)
        return Z_STREAM_ERROR;
    s = strm->state;
    wrap = s->wrap;
    if (wrap == 2 || (wrap == 1 && s->status != INIT_STATE) || s->lookahead)
        return Z_STREAM_ERROR;

    /* when using zlib wrappers, compute Adler-32 for provided dictionary */
    if (wrap == 1)
        strm->adler = adler32(strm->adler, dictionary, dictLength);
    s->wrap = 0;                    /* avoid computing Adler-32 in read_buf */

    /* if dictionary would fill window, just replace the history */
    if (dictLength >= s->w_size) {
        if (wrap == 0) {            /* already empty otherwise */
            CLEAR_HASH(s);
            s->strstart = 0;
            s->block_start = 0L;
            s->insert = 0;
        }
        dictionary += dictLength - s->w_size;  /* use the tail */
        dictLength = s->w_size;
    }

    /* insert dictionary into window and hash */
    avail = strm->avail_in;
    next = strm->next_in;
    strm->avail_in = dictLength;
    strm->next_in = (z_const Bytef *)dictionary;
    fill_window(s);
    while (s->lookahead >= MIN_MATCH) {
        str = s->strstart;
        n = s->lookahead - (MIN_MATCH-1);
        do {
            UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
            s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
            s->head[s->ins_h] = (Pos)str;
            str++;
        } while (--n);
        s->strstart = str;
        s->lookahead = MIN_MATCH-1;
        fill_window(s);
    }
    s->strstart += s->lookahead;
    s->block_start = (long)s->strstart;
    s->insert = s->lookahead;
    s->lookahead = 0;
    s->match_length = s->prev_length = MIN_MATCH-1;
    s->match_available = 0;
    strm->next_in = next;
    strm->avail_in = avail;
    s->wrap = wrap;
    return Z_OK;
}